

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O2

void __thiscall
TCLAP::CmdLine::xorAdd(CmdLine *this,vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *ors)

{
  Arg *pAVar1;
  pointer ppAVar2;
  allocator<char> local_51;
  string local_50 [32];
  
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::push_back(&(this->_xorHandler)._orList,ors);
  for (ppAVar2 = (ors->super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      ppAVar2 !=
      (ors->super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>)._M_impl.
      super__Vector_impl_data._M_finish; ppAVar2 = ppAVar2 + 1) {
    pAVar1 = *ppAVar2;
    pAVar1->_required = true;
    std::__cxx11::string::string<std::allocator<char>>(local_50,"OR required",&local_51);
    std::__cxx11::string::_M_assign((string *)&pAVar1->_requireLabel);
    std::__cxx11::string::~string(local_50);
    (*(this->super_CmdLineInterface)._vptr_CmdLineInterface[3])(this,*ppAVar2);
  }
  return;
}

Assistant:

inline void CmdLine::xorAdd( const std::vector<Arg*>& ors )
{
	_xorHandler.add( ors );

	for (ArgVectorIterator it = ors.begin(); it != ors.end(); it++)
	{
		(*it)->forceRequired();
		(*it)->setRequireLabel( "OR required" );
		add( *it );
	}
}